

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall tl::Vector<anims::NodeData>::resize<>(Vector<anims::NodeData> *this,size_t size)

{
  undefined8 *puVar1;
  ulong uVar2;
  NodeData *pNVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  if (this->_capacity < size) {
    grow(this,size);
  }
  uVar2 = this->_size;
  lVar4 = size - uVar2;
  if (uVar2 <= size && lVar4 != 0) {
    lVar5 = uVar2 * 0x18;
    while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
      pNVar3 = this->_data;
      puVar1 = (undefined8 *)((long)&pNVar3->position + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pNVar3->scale + lVar5) = 0;
      lVar5 = lVar5 + 0x18;
    }
  }
  this->_size = size;
  return;
}

Assistant:

void Vector<T>::resize(size_t size, ConstructorArgs&&... args)noexcept
{
    if(size > _capacity)
        grow(size);
    if(size < _size) {
        for(size_t i = size; i < _size; i++) {
            _data[i].~T();
        }
    }
    else if(size > _size) {
        for(size_t i = _size; i < size; i++) {
            new (&_data[i]) T(tl::forward<ConstructorArgs>(args)...);
        }
    }
    _size = size;
}